

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O1

void __thiscall kj::_::Mutex::assertLockedByCaller(Mutex *this,Exclusivity exclusivity)

{
  DebugExpression<unsigned_int> _kjCondition;
  Fault f;
  
  if (exclusivity == SHARED) {
    _kjCondition.value = this->futex & 0x3fffffff;
    if (_kjCondition.value == 0) {
      Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<unsigned_int>&,char_const(&)[56]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++"
                 ,0x18a,FAILED,"futex & SHARED_COUNT_MASK",
                 "_kjCondition,\"Tried to call getAlreadyLocked*() but lock is not held.\"",
                 &_kjCondition,
                 (char (*) [56])"Tried to call getAlreadyLocked*() but lock is not held.");
      Debug::Fault::fatal(&f);
    }
  }
  else if ((exclusivity == EXCLUSIVE) &&
          (_kjCondition.value = this->futex & 0x80000000, _kjCondition.value == 0)) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<unsigned_int>&,char_const(&)[56]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++"
               ,0x186,FAILED,"futex & EXCLUSIVE_HELD",
               "_kjCondition,\"Tried to call getAlreadyLocked*() but lock is not held.\"",
               &_kjCondition,
               (char (*) [56])"Tried to call getAlreadyLocked*() but lock is not held.");
    Debug::Fault::fatal(&f);
  }
  return;
}

Assistant:

void Mutex::assertLockedByCaller(Exclusivity exclusivity) const {
  switch (exclusivity) {
    case EXCLUSIVE:
      KJ_ASSERT(futex & EXCLUSIVE_HELD,
                "Tried to call getAlreadyLocked*() but lock is not held.");
      break;
    case SHARED:
      KJ_ASSERT(futex & SHARED_COUNT_MASK,
                "Tried to call getAlreadyLocked*() but lock is not held.");
      break;
  }
}